

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_root.c
# Opt level: O2

int arkRootInit(ARKodeMem ark_mem,int nrtfn,ARKRootFn g)

{
  long lVar1;
  uint uVar2;
  ARKodeRootMem pAVar3;
  realtype *__ptr;
  realtype *prVar4;
  int *piVar5;
  int *piVar6;
  ulong uVar7;
  char *module;
  int error_code;
  char *msgfmt;
  uint uVar8;
  size_t sVar9;
  undefined1 auVar10 [16];
  
  if (ark_mem == (ARKodeMem)0x0) {
    module = "ARKode";
    msgfmt = "arkode_mem = NULL illegal.";
    error_code = -0x15;
    ark_mem = (ARKodeMem)0x0;
    goto LAB_004b346b;
  }
  uVar8 = 0;
  if (0 < nrtfn) {
    uVar8 = nrtfn;
  }
  pAVar3 = ark_mem->root_mem;
  if (pAVar3 == (ARKodeRootMem)0x0) {
    pAVar3 = (ARKodeRootMem)malloc(0x88);
    ark_mem->root_mem = pAVar3;
    if (pAVar3 == (ARKodeRootMem)0x0) {
      arkProcessError(ark_mem,0,"ARKode","arkRootInit","Allocation of arkode_mem failed.");
      return -0x14;
    }
    pAVar3->gfun = (ARKRootFn)0x0;
    pAVar3->nrtfn = 0;
    pAVar3->irfnd = 0;
    pAVar3->gactive = (int *)0x0;
    pAVar3->iroots = (int *)0x0;
    pAVar3->rootdir = (int *)0x0;
    pAVar3->glo = (realtype *)0x0;
    pAVar3->ghi = (realtype *)0x0;
    pAVar3->grout = (realtype *)0x0;
    pAVar3->mxgnull = 1;
    pAVar3->root_data = ark_mem->user_data;
    ark_mem->lrw = ark_mem->lrw + 5;
    ark_mem->liw = ark_mem->liw + 0xc;
    uVar2 = 0;
  }
  else {
    uVar2 = pAVar3->nrtfn;
    if (0 < (int)uVar2 && uVar8 != uVar2) {
      free(pAVar3->glo);
      pAVar3 = ark_mem->root_mem;
      pAVar3->glo = (realtype *)0x0;
      free(pAVar3->ghi);
      pAVar3 = ark_mem->root_mem;
      pAVar3->ghi = (realtype *)0x0;
      free(pAVar3->grout);
      pAVar3 = ark_mem->root_mem;
      pAVar3->grout = (realtype *)0x0;
      free(pAVar3->iroots);
      pAVar3 = ark_mem->root_mem;
      pAVar3->iroots = (int *)0x0;
      free(pAVar3->rootdir);
      pAVar3 = ark_mem->root_mem;
      pAVar3->rootdir = (int *)0x0;
      free(pAVar3->gactive);
      pAVar3 = ark_mem->root_mem;
      pAVar3->gactive = (int *)0x0;
      uVar2 = pAVar3->nrtfn;
      lVar1 = (long)(int)uVar2 * 3;
      auVar10._8_4_ = (int)lVar1;
      auVar10._0_8_ = lVar1;
      auVar10._12_4_ = (int)((ulong)lVar1 >> 0x20);
      ark_mem->lrw = ark_mem->lrw + (long)(int)uVar2 * -3;
      ark_mem->liw = ark_mem->liw - auVar10._8_8_;
    }
  }
  if (nrtfn < 1) {
    pAVar3->nrtfn = 0;
    pAVar3->gfun = (ARKRootFn)0x0;
    return 0;
  }
  if (uVar8 == uVar2) {
    if (pAVar3->gfun == g) {
      return 0;
    }
    if (g != (ARKRootFn)0x0) {
      pAVar3->gfun = g;
      return 0;
    }
    free(pAVar3->glo);
    pAVar3 = ark_mem->root_mem;
    pAVar3->glo = (realtype *)0x0;
    free(pAVar3->ghi);
    pAVar3 = ark_mem->root_mem;
    pAVar3->ghi = (realtype *)0x0;
    free(pAVar3->grout);
    pAVar3 = ark_mem->root_mem;
    pAVar3->grout = (realtype *)0x0;
    free(pAVar3->iroots);
    pAVar3 = ark_mem->root_mem;
    pAVar3->iroots = (int *)0x0;
    free(pAVar3->rootdir);
    pAVar3 = ark_mem->root_mem;
    pAVar3->rootdir = (int *)0x0;
    free(pAVar3->gactive);
    ark_mem->root_mem->gactive = (int *)0x0;
    ark_mem->lrw = ark_mem->lrw - (ulong)(uVar8 * 3);
    ark_mem->liw = ark_mem->liw - (ulong)(uVar8 * 3);
  }
  else {
    pAVar3->nrtfn = uVar8;
    if (g != (ARKRootFn)0x0) {
      pAVar3->gfun = g;
      sVar9 = (ulong)uVar8 * 8;
      __ptr = (realtype *)malloc(sVar9);
      pAVar3->glo = __ptr;
      if (__ptr == (realtype *)0x0) {
LAB_004b3450:
        module = "ARKode";
      }
      else {
        prVar4 = (realtype *)malloc(sVar9);
        pAVar3->ghi = prVar4;
        if (prVar4 == (realtype *)0x0) {
          free(__ptr);
          pAVar3->glo = (realtype *)0x0;
          goto LAB_004b3450;
        }
        prVar4 = (realtype *)malloc(sVar9);
        pAVar3->grout = prVar4;
        if (prVar4 == (realtype *)0x0) {
          free(__ptr);
          pAVar3->glo = (realtype *)0x0;
          free(pAVar3->ghi);
          ark_mem->root_mem->ghi = (realtype *)0x0;
          goto LAB_004b3450;
        }
        sVar9 = (ulong)uVar8 << 2;
        piVar5 = (int *)malloc(sVar9);
        pAVar3->iroots = piVar5;
        if (piVar5 == (int *)0x0) {
          free(__ptr);
          pAVar3->glo = (realtype *)0x0;
          free(pAVar3->ghi);
          pAVar3 = ark_mem->root_mem;
          pAVar3->ghi = (realtype *)0x0;
          free(pAVar3->grout);
          ark_mem->root_mem->grout = (realtype *)0x0;
          goto LAB_004b3450;
        }
        piVar5 = (int *)malloc(sVar9);
        pAVar3->rootdir = piVar5;
        if (piVar5 == (int *)0x0) {
          free(__ptr);
          pAVar3->glo = (realtype *)0x0;
          free(pAVar3->ghi);
          pAVar3 = ark_mem->root_mem;
          pAVar3->ghi = (realtype *)0x0;
          free(pAVar3->grout);
          pAVar3 = ark_mem->root_mem;
          pAVar3->grout = (realtype *)0x0;
          free(pAVar3->iroots);
          ark_mem->root_mem->iroots = (int *)0x0;
          goto LAB_004b3450;
        }
        piVar6 = (int *)malloc(sVar9);
        pAVar3->gactive = piVar6;
        if (piVar6 != (int *)0x0) {
          for (uVar7 = 0; (uint)nrtfn != uVar7; uVar7 = uVar7 + 1) {
            piVar5[uVar7] = 0;
          }
          for (uVar7 = 0; (uint)nrtfn != uVar7; uVar7 = uVar7 + 1) {
            piVar6[uVar7] = 1;
          }
          ark_mem->lrw = (ulong)(uVar8 * 3) + ark_mem->lrw;
          ark_mem->liw = (ulong)(uVar8 * 3) + ark_mem->liw;
          return 0;
        }
        free(__ptr);
        pAVar3->glo = (realtype *)0x0;
        free(pAVar3->ghi);
        pAVar3 = ark_mem->root_mem;
        pAVar3->ghi = (realtype *)0x0;
        free(pAVar3->grout);
        pAVar3 = ark_mem->root_mem;
        pAVar3->grout = (realtype *)0x0;
        free(pAVar3->iroots);
        pAVar3 = ark_mem->root_mem;
        pAVar3->iroots = (int *)0x0;
        free(pAVar3->rootdir);
        ark_mem->root_mem->rootdir = (int *)0x0;
        module = "ARKodeS";
      }
      msgfmt = "A memory request failed.";
      error_code = -0x14;
      goto LAB_004b346b;
    }
  }
  module = "ARKode";
  msgfmt = "g = NULL illegal.";
  error_code = -0x16;
LAB_004b346b:
  arkProcessError(ark_mem,error_code,module,"arkRootInit",msgfmt);
  return error_code;
}

Assistant:

int arkRootInit(ARKodeMem ark_mem, int nrtfn, ARKRootFn g)
{
  int i, nrt;

  /* Check ark_mem pointer */
  if (ark_mem == NULL) {
    arkProcessError(NULL, ARK_MEM_NULL, "ARKode",
                    "arkRootInit", MSG_ARK_NO_MEM);
    return(ARK_MEM_NULL);
  }
  nrt = (nrtfn < 0) ? 0 : nrtfn;

  /* If unallocated, allocate rootfinding structure, set defaults, update space */
  if (ark_mem->root_mem == NULL) {
    ark_mem->root_mem = (ARKodeRootMem) malloc(sizeof(struct ARKodeRootMemRec));
    if (ark_mem->root_mem == NULL) {
      arkProcessError(ark_mem, 0, "ARKode", "arkRootInit",
                      MSG_ARK_ARKMEM_FAIL);
      return(ARK_MEM_FAIL);
    }
    ark_mem->root_mem->glo       = NULL;
    ark_mem->root_mem->ghi       = NULL;
    ark_mem->root_mem->grout     = NULL;
    ark_mem->root_mem->iroots    = NULL;
    ark_mem->root_mem->rootdir   = NULL;
    ark_mem->root_mem->gfun      = NULL;
    ark_mem->root_mem->nrtfn     = 0;
    ark_mem->root_mem->irfnd     = 0;
    ark_mem->root_mem->gactive   = NULL;
    ark_mem->root_mem->mxgnull   = 1;
    ark_mem->root_mem->root_data = ark_mem->user_data;

    ark_mem->lrw += ARK_ROOT_LRW;
    ark_mem->liw += ARK_ROOT_LIW;
  }

  /* If rerunning arkRootInit() with a different number of root
     functions (changing number of gfun components), then free
     currently held memory resources */
  if ((nrt != ark_mem->root_mem->nrtfn) && (ark_mem->root_mem->nrtfn > 0)) {
    free(ark_mem->root_mem->glo);     ark_mem->root_mem->glo     = NULL;
    free(ark_mem->root_mem->ghi);     ark_mem->root_mem->ghi     = NULL;
    free(ark_mem->root_mem->grout);   ark_mem->root_mem->grout   = NULL;
    free(ark_mem->root_mem->iroots);  ark_mem->root_mem->iroots  = NULL;
    free(ark_mem->root_mem->rootdir); ark_mem->root_mem->rootdir = NULL;
    free(ark_mem->root_mem->gactive); ark_mem->root_mem->gactive = NULL;

    ark_mem->lrw -= 3 * (ark_mem->root_mem->nrtfn);
    ark_mem->liw -= 3 * (ark_mem->root_mem->nrtfn);
  }

  /* If arkRootInit() was called with nrtfn == 0, then set
     nrtfn to zero and gfun to NULL before returning */
  if (nrt == 0) {
    ark_mem->root_mem->nrtfn = nrt;
    ark_mem->root_mem->gfun = NULL;
    return(ARK_SUCCESS);
  }

  /* If rerunning arkRootInit() with the same number of root
     functions (not changing number of gfun components), then
     check if the root function argument has changed */
  /* If g != NULL then return as currently reserved memory
     resources will suffice */
  if (nrt == ark_mem->root_mem->nrtfn) {
    if (g != ark_mem->root_mem->gfun) {
      if (g == NULL) {
        free(ark_mem->root_mem->glo);     ark_mem->root_mem->glo     = NULL;
        free(ark_mem->root_mem->ghi);     ark_mem->root_mem->ghi     = NULL;
        free(ark_mem->root_mem->grout);   ark_mem->root_mem->grout   = NULL;
        free(ark_mem->root_mem->iroots);  ark_mem->root_mem->iroots  = NULL;
        free(ark_mem->root_mem->rootdir); ark_mem->root_mem->rootdir = NULL;
        free(ark_mem->root_mem->gactive); ark_mem->root_mem->gactive = NULL;

        ark_mem->lrw -= 3*nrt;
        ark_mem->liw -= 3*nrt;

        arkProcessError(ark_mem, ARK_ILL_INPUT, "ARKode",
                        "arkRootInit", MSG_ARK_NULL_G);
        return(ARK_ILL_INPUT);
      }
      else {
        ark_mem->root_mem->gfun = g;
        return(ARK_SUCCESS);
      }
    }
    else return(ARK_SUCCESS);
  }

  /* Set variable values in ARKode memory block */
  ark_mem->root_mem->nrtfn = nrt;
  if (g == NULL) {
    arkProcessError(ark_mem, ARK_ILL_INPUT, "ARKode",
                    "arkRootInit", MSG_ARK_NULL_G);
    return(ARK_ILL_INPUT);
  }
  else ark_mem->root_mem->gfun = g;

  /* Allocate necessary memory and return */
  ark_mem->root_mem->glo = NULL;
  ark_mem->root_mem->glo = (realtype *) malloc(nrt*sizeof(realtype));
  if (ark_mem->root_mem->glo == NULL) {
    arkProcessError(ark_mem, ARK_MEM_FAIL, "ARKode",
                    "arkRootInit", MSG_ARK_MEM_FAIL);
    return(ARK_MEM_FAIL);
  }
  ark_mem->root_mem->ghi = NULL;
  ark_mem->root_mem->ghi = (realtype *) malloc(nrt*sizeof(realtype));
  if (ark_mem->root_mem->ghi == NULL) {
    free(ark_mem->root_mem->glo); ark_mem->root_mem->glo = NULL;
    arkProcessError(ark_mem, ARK_MEM_FAIL, "ARKode",
                    "arkRootInit", MSG_ARK_MEM_FAIL);
    return(ARK_MEM_FAIL);
  }
  ark_mem->root_mem->grout = NULL;
  ark_mem->root_mem->grout = (realtype *) malloc(nrt*sizeof(realtype));
  if (ark_mem->root_mem->grout == NULL) {
    free(ark_mem->root_mem->glo); ark_mem->root_mem->glo = NULL;
    free(ark_mem->root_mem->ghi); ark_mem->root_mem->ghi = NULL;
    arkProcessError(ark_mem, ARK_MEM_FAIL, "ARKode",
                    "arkRootInit", MSG_ARK_MEM_FAIL);
    return(ARK_MEM_FAIL);
  }
  ark_mem->root_mem->iroots = NULL;
  ark_mem->root_mem->iroots = (int *) malloc(nrt*sizeof(int));
  if (ark_mem->root_mem->iroots == NULL) {
    free(ark_mem->root_mem->glo); ark_mem->root_mem->glo = NULL;
    free(ark_mem->root_mem->ghi); ark_mem->root_mem->ghi = NULL;
    free(ark_mem->root_mem->grout); ark_mem->root_mem->grout = NULL;
    arkProcessError(ark_mem, ARK_MEM_FAIL, "ARKode",
                    "arkRootInit", MSG_ARK_MEM_FAIL);
    return(ARK_MEM_FAIL);
  }
  ark_mem->root_mem->rootdir = NULL;
  ark_mem->root_mem->rootdir = (int *) malloc(nrt*sizeof(int));
  if (ark_mem->root_mem->rootdir == NULL) {
    free(ark_mem->root_mem->glo); ark_mem->root_mem->glo = NULL;
    free(ark_mem->root_mem->ghi); ark_mem->root_mem->ghi = NULL;
    free(ark_mem->root_mem->grout); ark_mem->root_mem->grout = NULL;
    free(ark_mem->root_mem->iroots); ark_mem->root_mem->iroots = NULL;
    arkProcessError(ark_mem, ARK_MEM_FAIL, "ARKode",
                    "arkRootInit", MSG_ARK_MEM_FAIL);
    return(ARK_MEM_FAIL);
  }
  ark_mem->root_mem->gactive = NULL;
  ark_mem->root_mem->gactive = (booleantype *) malloc(nrt*sizeof(booleantype));
  if (ark_mem->root_mem->gactive == NULL) {
    free(ark_mem->root_mem->glo); ark_mem->root_mem->glo = NULL;
    free(ark_mem->root_mem->ghi); ark_mem->root_mem->ghi = NULL;
    free(ark_mem->root_mem->grout); ark_mem->root_mem->grout = NULL;
    free(ark_mem->root_mem->iroots); ark_mem->root_mem->iroots = NULL;
    free(ark_mem->root_mem->rootdir); ark_mem->root_mem->rootdir = NULL;
    arkProcessError(ark_mem, ARK_MEM_FAIL, "ARKodeS",
                    "arkRootInit", MSG_ARK_MEM_FAIL);
    return(ARK_MEM_FAIL);
  }

  /* Set default values for rootdir (both directions) */
  for(i=0; i<nrt; i++) ark_mem->root_mem->rootdir[i] = 0;

  /* Set default values for gactive (all active) */
  for(i=0; i<nrt; i++) ark_mem->root_mem->gactive[i] = SUNTRUE;

  ark_mem->lrw += 3*nrt;
  ark_mem->liw += 3*nrt;

  return(ARK_SUCCESS);
}